

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

bool __thiscall jpge::memory_stream::put_buf(memory_stream *this,void *pBuf,int len)

{
  uint uVar1;
  
  uVar1 = this->m_buf_size - this->m_buf_ofs;
  if ((uint)len <= uVar1) {
    memcpy(this->m_pBuf + this->m_buf_ofs,pBuf,(long)len);
    this->m_buf_ofs = this->m_buf_ofs + len;
  }
  return (uint)len <= uVar1;
}

Assistant:

virtual bool put_buf(const void* pBuf, int len)
		{
			uint buf_remaining = m_buf_size - m_buf_ofs;
			if ((uint)len > buf_remaining)
				return false;
			memcpy(m_pBuf + m_buf_ofs, pBuf, len);
			m_buf_ofs += len;
			return true;
		}